

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void __thiscall bidirectional::Search::Search(Search *this,Directions *direction_in)

{
  _Rb_tree_header *p_Var1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<labelling::Label,_std::allocator<labelling::Label>_> *pvVar3;
  
  this->direction = *direction_in;
  this->stop = false;
  this->bound_exceeded = false;
  this->unprocessed_count = 0;
  this->processed_count = 0;
  this->generated_count = 0;
  pvVar2 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  *(undefined8 *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl = 0;
  *(pointer *)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl + 8) =
       (pointer)0x0;
  *(pointer *)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl + 0x10)
       = (pointer)0x0;
  (this->lower_bound_weight)._M_t.
  super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>._M_head_impl =
       pvVar2;
  p_Var1 = &(this->visited_vertices)._M_t._M_impl.super__Rb_tree_header;
  (this->visited_vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->visited_vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->visited_vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->visited_vertices)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->visited_vertices)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->current_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->current_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->intermediate_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->intermediate_label).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->efficient_labels).
  super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->efficient_labels).
  super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->efficient_labels).
  super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->best_labels).
  super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->best_labels).
  super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->best_labels).
  super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar3 = (vector<labelling::Label,_std::allocator<labelling::Label>_> *)operator_new(0x18);
  *(undefined8 *)
   &(pvVar3->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)._M_impl = 0;
  *(pointer *)
   ((long)&(pvVar3->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)._M_impl
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pvVar3->super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>)._M_impl
   + 0x10) = (pointer)0x0;
  (this->unprocessed_labels)._M_t.
  super___uniq_ptr_impl<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_std::default_delete<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
  .super__Head_base<0UL,_std::vector<labelling::Label,_std::allocator<labelling::Label>_>_*,_false>.
  _M_head_impl = pvVar3;
  return;
}

Assistant:

Search::Search(const Directions& direction_in)
    : direction(direction_in),
      lower_bound_weight(std::make_unique<std::vector<double>>()),
      unprocessed_labels(std::make_unique<std::vector<labelling::Label>>()){}